

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O0

void __thiscall binpac::FlowBuffer::ExpandBuffer(FlowBuffer *this,int length)

{
  undefined8 uVar1;
  void *pvVar2;
  uint in_ESI;
  char *in_RDI;
  ExceptionFlowBufferAlloc *unaff_retaddr;
  uchar *new_buf;
  string reason;
  char local_30 [36];
  uint local_c;
  char *reason_00;
  
  if (*(int *)(in_RDI + 0xc) < (int)in_ESI) {
    local_c = in_ESI;
    if ((int)in_ESI < (int)_DAT_0010722c) {
      local_c = _DAT_0010722c;
    }
    if (SBORROW4(local_c,*(int *)(in_RDI + 0xc) * 2) !=
        (int)(local_c + *(int *)(in_RDI + 0xc) * -2) < 0) {
      local_c = *(int *)(in_RDI + 0xc) << 1;
    }
    if ((int)policy < (int)local_c) {
      (anonymous_namespace)::strfmt_abi_cxx11_
                (local_30,"expand past max capacity %d/%d",(ulong)local_c,(ulong)policy);
      uVar1 = __cxa_allocate_exception(0x20);
      std::__cxx11::string::c_str();
      ExceptionFlowBufferAlloc::ExceptionFlowBufferAlloc(unaff_retaddr,in_RDI);
      __cxa_throw(uVar1,&ExceptionFlowBufferAlloc::typeinfo,
                  ExceptionFlowBufferAlloc::~ExceptionFlowBufferAlloc);
    }
    *(uint *)(in_RDI + 0xc) = local_c;
    reason_00 = in_RDI;
    pvVar2 = realloc(*(void **)(in_RDI + 0x10),(long)*(int *)(in_RDI + 0xc));
    if (pvVar2 == (void *)0x0) {
      uVar1 = __cxa_allocate_exception(0x20);
      ExceptionFlowBufferAlloc::ExceptionFlowBufferAlloc(unaff_retaddr,reason_00);
      __cxa_throw(uVar1,&ExceptionFlowBufferAlloc::typeinfo,
                  ExceptionFlowBufferAlloc::~ExceptionFlowBufferAlloc);
    }
    *(void **)(in_RDI + 0x10) = pvVar2;
  }
  return;
}

Assistant:

void FlowBuffer::ExpandBuffer(int length)
	{
	if ( buffer_length_ >= length )
		return;

	if ( length < policy.min_capacity )
		length = policy.min_capacity;

	if ( length < buffer_length_ * 2 )
		length = buffer_length_ * 2;

	if ( length > policy.max_capacity )
		{
		std::string reason = strfmt("expand past max capacity %d/%d", length, policy.max_capacity);
		throw ExceptionFlowBufferAlloc(reason.c_str());
		}

	// Allocate a new buffer and copy the existing contents
	buffer_length_ = length;
	unsigned char* new_buf = (unsigned char*)realloc(buffer_, buffer_length_);

	if ( ! new_buf )
		throw ExceptionFlowBufferAlloc("expand realloc OOM");

	buffer_ = new_buf;
	}